

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

void preprocess_upvalues(Proc *proc)

{
  int *piVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  Proc *proc_00;
  uint unaff_EBP;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  PtrListIterator child_prociter__;
  PtrListIterator local_60;
  PtrListIterator local_48;
  
  raviX_ptrlist_forward_iterator
            (&local_48,(PtrList *)(proc->function_expr->field_2).function_expr.upvalues);
  pvVar3 = raviX_ptrlist_iter_next(&local_48);
  if (pvVar3 != (void *)0x0) {
    do {
      piVar1 = *(int **)((long)pvVar3 + 0x18);
      if (*piVar1 == 0) {
        lVar2 = *(long *)(*(long *)((long)pvVar3 + 0x20) + 0x20);
        bVar7 = lVar2 == **(long **)(piVar1 + 8);
        if (bVar7) {
          unaff_EBP = **(uint **)(piVar1 + 0xe) >> 4;
        }
        uVar6 = (uint)bVar7;
        uVar5 = (uint)bVar7;
        if (lVar2 != **(long **)(piVar1 + 8)) goto LAB_0011deaf;
      }
      else {
        uVar5 = 0;
LAB_0011deaf:
        uVar6 = uVar5;
        lVar2 = *(long *)(*(long *)((long)pvVar3 + 0x20) + 0x20);
        if (lVar2 == 0) {
          if (*piVar1 != 4) {
            __assert_fail("underlying->symbol_type == SYM_ENV",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                          ,0xde6,"unsigned int get_upvalue_idx(Proc *, LuaSymbol *, _Bool *)");
          }
          unaff_EBP = 0;
          uVar6 = 1;
        }
        else {
          raviX_ptrlist_forward_iterator(&local_60,*(PtrList **)(lVar2 + 0x48));
          do {
            pvVar4 = raviX_ptrlist_iter_next(&local_60);
            bVar7 = pvVar4 == (void *)0x0;
            if (bVar7) goto LAB_0011dee7;
          } while (*(long *)((long)pvVar4 + 0x18) != *(long *)((long)pvVar3 + 0x18));
          unaff_EBP = *(uint *)((long)pvVar4 + 0x28);
          bVar7 = false;
LAB_0011dee7:
          if (bVar7) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                          ,0xdf2,"unsigned int get_upvalue_idx(Proc *, LuaSymbol *, _Bool *)");
          }
        }
      }
      uVar5 = unaff_EBP << 0x11 | uVar6 << 0x10;
      unaff_EBP = uVar5 >> 0x10;
      *(short *)((long)pvVar3 + 0x2a) = (short)(uVar5 >> 0x10);
      pvVar3 = raviX_ptrlist_iter_next(&local_48);
    } while (pvVar3 != (void *)0x0);
  }
  raviX_ptrlist_forward_iterator(&local_60,(PtrList *)proc->procs);
  proc_00 = (Proc *)raviX_ptrlist_iter_next(&local_60);
  if (proc_00 != (Proc *)0x0) {
    do {
      preprocess_upvalues(proc_00);
      proc_00 = (Proc *)raviX_ptrlist_iter_next(&local_60);
    } while (proc_00 != (Proc *)0x0);
  }
  return;
}

Assistant:

static void preprocess_upvalues(Proc *proc)
{
	compute_upvalue_attributes(proc);
	Proc *child_proc;
	FOR_EACH_PTR(proc->procs, Proc, child_proc) { preprocess_upvalues(child_proc); }
	END_FOR_EACH_PTR(childproc)
}